

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_hash.c
# Opt level: O0

void bashHashStepH(void *buf,size_t count,void *state)

{
  octet *in_RDX;
  ulong in_RSI;
  bash_hash_st *st;
  void *in_stack_ffffffffffffffd8;
  ulong local_10;
  
  if (in_RSI < (ulong)(*(long *)(in_RDX + 0x180) - *(long *)(in_RDX + 0x188))) {
    memCopy(in_RDX,in_stack_ffffffffffffffd8,0x13052f);
    *(ulong *)(in_RDX + 0x188) = in_RSI + *(long *)(in_RDX + 0x188);
  }
  else {
    memCopy(in_RDX,in_stack_ffffffffffffffd8,0x13057f);
    local_10 = in_RSI - (*(long *)(in_RDX + 0x180) - *(long *)(in_RDX + 0x188));
    bashF(in_RDX,in_stack_ffffffffffffffd8);
    while (*(ulong *)(in_RDX + 0x180) <= local_10) {
      memCopy(in_RDX,in_stack_ffffffffffffffd8,0x13060f);
      local_10 = local_10 - *(long *)(in_RDX + 0x180);
      bashF(in_RDX,in_stack_ffffffffffffffd8);
    }
    *(ulong *)(in_RDX + 0x188) = local_10;
    if (local_10 != 0) {
      memCopy(in_RDX,in_stack_ffffffffffffffd8,0x130681);
    }
  }
  return;
}

Assistant:

void bashHashStepH(const void* buf, size_t count, void* state)
{
	bash_hash_st* st = (bash_hash_st*)state;
	ASSERT(memIsDisjoint2(st, bashHash_keep(), buf, count));
	// не накопился полный буфер?
	if (count < st->buf_len - st->pos)
	{
		memCopy(st->s + st->pos, buf, count);
		st->pos += count;
		return;
	}
	// новый полный буфер
	memCopy(st->s + st->pos, buf, st->buf_len - st->pos);
	buf = (const octet*)buf + st->buf_len - st->pos;
	count -= st->buf_len - st->pos;
	bashF(st->s, st->stack);
	// цикл по полным блокам
	while (count >= st->buf_len)
	{
		memCopy(st->s, buf, st->buf_len);
		buf = (const octet*)buf + st->buf_len;
		count -= st->buf_len;
		bashF(st->s, st->stack);
	}
	// неполный блок?
	if (st->pos = count)
		memCopy(st->s, buf, count);
}